

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteDirectoryRules2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *rootLG,DirectoryTarget *dt)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  bool bVar1;
  string *path;
  ostream *poVar2;
  string dir;
  string local_50;
  
  this_00 = (cmLocalUnixMakefileGenerator3 *)dt->LG;
  path = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this_00);
  cmOutputConverter::MaybeRelativeToTopBinDir(&local_50,(cmOutputConverter *)rootLG,path);
  cmSystemTools::ConvertToOutputPath(&dir,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  cmLocalUnixMakefileGenerator3::WriteDivider(rootLG,ruleFileStream);
  bVar1 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this_00);
  if (bVar1) {
    std::operator<<(ruleFileStream,"# Directory level rules for the build root directory");
  }
  else {
    poVar2 = std::operator<<(ruleFileStream,"# Directory level rules for directory ");
    std::operator<<(poVar2,(string *)&dir);
  }
  std::operator<<(ruleFileStream,"\n\n");
  std::__cxx11::string::~string((string *)&dir);
  dir._M_dataplus._M_p = (pointer)0x0;
  dir._M_string_length = 0;
  dir.field_2._M_allocated_capacity = 0;
  WriteDirectoryRule2(this,ruleFileStream,rootLG,dt,"all",true,false,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&dir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&dir);
  dir._M_dataplus._M_p = (pointer)0x0;
  dir._M_string_length = 0;
  dir.field_2._M_allocated_capacity = 0;
  WriteDirectoryRule2(this,ruleFileStream,rootLG,dt,"preinstall",true,true,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&dir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&dir);
  dir._M_dataplus._M_p = (pointer)0x0;
  dir._M_string_length = 0;
  dir.field_2._M_allocated_capacity = 0;
  cmLocalUnixMakefileGenerator3::AppendDirectoryCleanCommand
            (this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&dir);
  WriteDirectoryRule2(this,ruleFileStream,rootLG,dt,"clean",false,false,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&dir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&dir);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteDirectoryRules2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3& rootLG,
  DirectoryTarget const& dt)
{
  auto* lg = static_cast<cmLocalUnixMakefileGenerator3*>(dt.LG);
  // Begin the directory-level rules section.
  {
    std::string dir = cmSystemTools::ConvertToOutputPath(
      rootLG.MaybeRelativeToTopBinDir(lg->GetCurrentBinaryDirectory()));
    rootLG.WriteDivider(ruleFileStream);
    if (lg->IsRootMakefile()) {
      ruleFileStream << "# Directory level rules for the build root directory";
    } else {
      ruleFileStream << "# Directory level rules for directory " << dir;
    }
    ruleFileStream << "\n\n";
  }

  // Write directory-level rules for "all".
  this->WriteDirectoryRule2(ruleFileStream, rootLG, dt, "all", true, false);

  // Write directory-level rules for "preinstall".
  this->WriteDirectoryRule2(ruleFileStream, rootLG, dt, "preinstall", true,
                            true);

  // Write directory-level rules for "clean".
  {
    std::vector<std::string> cmds;
    lg->AppendDirectoryCleanCommand(cmds);
    this->WriteDirectoryRule2(ruleFileStream, rootLG, dt, "clean", false,
                              false, cmds);
  }
}